

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

void __thiscall dg::llvmdg::CallGraph::CallGraph(CallGraph *this,Module *m)

{
  _Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false> this_00;
  
  this_00._M_head_impl = (CallGraphImpl *)operator_new(0xe0);
  LazyLLVMCallGraph::LazyLLVMCallGraph
            ((LazyLLVMCallGraph *)this_00._M_head_impl,m,(LLVMPointerAnalysis *)0x0);
  (this->_impl)._M_t.
  super___uniq_ptr_impl<dg::llvmdg::CallGraphImpl,_std::default_delete<dg::llvmdg::CallGraphImpl>_>.
  _M_t.
  super__Tuple_impl<0UL,_dg::llvmdg::CallGraphImpl_*,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
  .super__Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false>._M_head_impl = this_00._M_head_impl;
  return;
}

Assistant:

CallGraph(const llvm::Module *m) : _impl(new LazyLLVMCallGraph(m)) {}